

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_effects.c
# Opt level: O3

MOJOSHADER_parseData * copyparsedata(MOJOSHADER_parseData *src,MOJOSHADER_malloc m,void *d)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  MOJOSHADER_error *pMVar4;
  MOJOSHADER_uniform *pMVar5;
  MOJOSHADER_attribute *pMVar6;
  MOJOSHADER_free p_Var7;
  undefined8 uVar8;
  MOJOSHADER_shaderType MVar9;
  int iVar10;
  MOJOSHADER_parseData *__s;
  MOJOSHADER_error *pMVar11;
  size_t sVar12;
  char *pcVar13;
  MOJOSHADER_uniform *pMVar14;
  MOJOSHADER_constant *__dest;
  MOJOSHADER_sampler *pMVar15;
  MOJOSHADER_sampler *pMVar16;
  MOJOSHADER_attribute *pMVar17;
  MOJOSHADER_swizzle *__dest_00;
  MOJOSHADER_symbol *__s_00;
  MOJOSHADER_preshader *pMVar18;
  long lVar19;
  long lVar20;
  uint uVar21;
  
  __s = (MOJOSHADER_parseData *)(*m)(0xd0,d);
  memset(__s,0,0xd0);
  p_Var7 = src->free;
  __s->malloc = src->malloc;
  __s->free = p_Var7;
  __s->malloc_data = src->malloc_data;
  uVar21 = src->error_count * 0x18;
  __s->error_count = src->error_count;
  pMVar11 = (MOJOSHADER_error *)(*m)(uVar21,d);
  __s->errors = pMVar11;
  memset(pMVar11,0,(ulong)uVar21);
  if (0 < __s->error_count) {
    pMVar11 = src->errors;
    lVar20 = 0;
    lVar19 = 0;
    do {
      sVar12 = strlen(*(char **)((long)&pMVar11->error + lVar20));
      pcVar13 = (char *)(*m)((int)sVar12 + 1,d);
      strcpy(pcVar13,*(char **)((long)&src->errors->error + lVar20));
      *(char **)((long)&__s->errors->error + lVar20) = pcVar13;
      sVar12 = strlen(*(char **)((long)&src->errors->filename + lVar20));
      pcVar13 = (char *)(*m)((int)sVar12 + 1,d);
      strcpy(pcVar13,*(char **)((long)&src->errors->filename + lVar20));
      pMVar4 = __s->errors;
      *(char **)((long)&pMVar4->filename + lVar20) = pcVar13;
      pMVar11 = src->errors;
      *(undefined4 *)((long)&pMVar4->error_position + lVar20) =
           *(undefined4 *)((long)&pMVar11->error_position + lVar20);
      lVar19 = lVar19 + 1;
      lVar20 = lVar20 + 0x18;
    } while (lVar19 < __s->error_count);
  }
  __s->profile = src->profile;
  iVar3 = src->output_len;
  __s->output_len = iVar3;
  pcVar13 = (char *)(*m)(iVar3,d);
  memcpy(pcVar13,src->output,(long)src->output_len);
  __s->output = pcVar13;
  MVar9 = src->shader_type;
  iVar3 = src->major_ver;
  iVar10 = src->minor_ver;
  __s->instruction_count = src->instruction_count;
  __s->shader_type = MVar9;
  __s->major_ver = iVar3;
  __s->minor_ver = iVar10;
  uVar21 = src->uniform_count * 0x18;
  __s->uniform_count = src->uniform_count;
  pMVar14 = (MOJOSHADER_uniform *)(*m)(uVar21,d);
  __s->uniforms = pMVar14;
  memset(pMVar14,0,(ulong)uVar21);
  if (0 < __s->uniform_count) {
    pMVar14 = __s->uniforms;
    lVar19 = 0;
    lVar20 = 0;
    do {
      pMVar5 = src->uniforms;
      puVar1 = (undefined8 *)((long)&pMVar5->type + lVar19);
      uVar8 = puVar1[1];
      puVar2 = (undefined8 *)((long)&pMVar14->type + lVar19);
      *puVar2 = *puVar1;
      puVar2[1] = uVar8;
      sVar12 = strlen(*(char **)((long)&pMVar5->name + lVar19));
      pcVar13 = (char *)(*m)((int)sVar12 + 1,d);
      strcpy(pcVar13,*(char **)((long)&src->uniforms->name + lVar19));
      pMVar14 = __s->uniforms;
      *(char **)((long)&pMVar14->name + lVar19) = pcVar13;
      lVar20 = lVar20 + 1;
      lVar19 = lVar19 + 0x18;
    } while (lVar20 < __s->uniform_count);
  }
  uVar21 = src->constant_count * 0x18;
  __s->constant_count = src->constant_count;
  __dest = (MOJOSHADER_constant *)(*m)(uVar21,d);
  __s->constants = __dest;
  memcpy(__dest,src->constants,(ulong)uVar21);
  uVar21 = src->sampler_count * 0x18;
  __s->sampler_count = src->sampler_count;
  pMVar15 = (MOJOSHADER_sampler *)(*m)(uVar21,d);
  __s->samplers = pMVar15;
  memset(pMVar15,0,(ulong)uVar21);
  if (0 < __s->sampler_count) {
    pMVar15 = src->samplers;
    pMVar16 = __s->samplers;
    lVar19 = 0;
    lVar20 = 0;
    do {
      *(undefined8 *)((long)&pMVar16->type + lVar19) =
           *(undefined8 *)((long)&pMVar15->type + lVar19);
      sVar12 = strlen(*(char **)((long)&pMVar15->name + lVar19));
      pcVar13 = (char *)(*m)((int)sVar12 + 1,d);
      strcpy(pcVar13,*(char **)((long)&src->samplers->name + lVar19));
      pMVar16 = __s->samplers;
      *(char **)((long)&pMVar16->name + lVar19) = pcVar13;
      pMVar15 = src->samplers;
      *(undefined4 *)((long)&pMVar16->texbem + lVar19) =
           *(undefined4 *)((long)&pMVar15->texbem + lVar19);
      lVar20 = lVar20 + 1;
      lVar19 = lVar19 + 0x18;
    } while (lVar20 < __s->sampler_count);
  }
  iVar3 = src->attribute_count;
  __s->attribute_count = iVar3;
  uVar21 = iVar3 << 4;
  pMVar17 = (MOJOSHADER_attribute *)(*m)(uVar21,d);
  __s->attributes = pMVar17;
  memset(pMVar17,0,(ulong)uVar21);
  if (0 < __s->attribute_count) {
    pMVar17 = __s->attributes;
    lVar19 = 0;
    lVar20 = 0;
    do {
      pMVar6 = src->attributes;
      *(undefined8 *)((long)&pMVar17->usage + lVar19) =
           *(undefined8 *)((long)&pMVar6->usage + lVar19);
      sVar12 = strlen(*(char **)((long)&pMVar6->name + lVar19));
      pcVar13 = (char *)(*m)((int)sVar12 + 1,d);
      strcpy(pcVar13,*(char **)((long)&src->attributes->name + lVar19));
      pMVar17 = __s->attributes;
      *(char **)((long)&pMVar17->name + lVar19) = pcVar13;
      lVar20 = lVar20 + 1;
      lVar19 = lVar19 + 0x10;
    } while (lVar20 < __s->attribute_count);
  }
  iVar3 = src->output_count;
  __s->output_count = iVar3;
  uVar21 = iVar3 << 4;
  pMVar17 = (MOJOSHADER_attribute *)(*m)(uVar21,d);
  __s->outputs = pMVar17;
  memset(pMVar17,0,(ulong)uVar21);
  if (0 < __s->output_count) {
    pMVar17 = __s->outputs;
    lVar19 = 0;
    lVar20 = 0;
    do {
      pMVar6 = src->outputs;
      *(undefined8 *)((long)&pMVar17->usage + lVar19) =
           *(undefined8 *)((long)&pMVar6->usage + lVar19);
      sVar12 = strlen(*(char **)((long)&pMVar6->name + lVar19));
      pcVar13 = (char *)(*m)((int)sVar12 + 1,d);
      strcpy(pcVar13,*(char **)((long)&src->outputs->name + lVar19));
      pMVar17 = __s->outputs;
      *(char **)((long)&pMVar17->name + lVar19) = pcVar13;
      lVar20 = lVar20 + 1;
      lVar19 = lVar19 + 0x10;
    } while (lVar20 < __s->output_count);
  }
  uVar21 = src->swizzle_count * 0xc;
  __s->swizzle_count = src->swizzle_count;
  __dest_00 = (MOJOSHADER_swizzle *)(*m)(uVar21,d);
  __s->swizzles = __dest_00;
  memcpy(__dest_00,src->swizzles,(ulong)uVar21);
  uVar21 = src->symbol_count * 0x38;
  __s->symbol_count = src->symbol_count;
  __s_00 = (MOJOSHADER_symbol *)(*m)(uVar21,d);
  __s->symbols = __s_00;
  memset(__s_00,0,(ulong)uVar21);
  if (0 < __s->symbol_count) {
    lVar19 = 0;
    lVar20 = 0;
    do {
      copysymbol((MOJOSHADER_symbol *)((long)&__s->symbols->name + lVar19),
                 (MOJOSHADER_symbol *)((long)&src->symbols->name + lVar19),m,d);
      lVar20 = lVar20 + 1;
      lVar19 = lVar19 + 0x38;
    } while (lVar20 < __s->symbol_count);
  }
  if (src->preshader != (MOJOSHADER_preshader *)0x0) {
    pMVar18 = copypreshader(src->preshader,m,d);
    __s->preshader = pMVar18;
  }
  return __s;
}

Assistant:

MOJOSHADER_parseData *copyparsedata(const MOJOSHADER_parseData *src,
                                    MOJOSHADER_malloc m,
                                    void *d)
{
    int i;
    uint32 siz;
    char *stringcopy;
    MOJOSHADER_parseData *retval;

    retval = (MOJOSHADER_parseData *) m(sizeof (MOJOSHADER_parseData), d);
    memset(retval, '\0', sizeof (MOJOSHADER_parseData));

    /* Copy malloc/free */
    retval->malloc = src->malloc;
    retval->free = src->free;
    retval->malloc_data = src->malloc_data;

    // !!! FIXME: Out of memory check!
    #define COPY_STRING(location) \
        siz = strlen(src->location) + 1; \
        stringcopy = (char *) m(siz, d); \
        strcpy(stringcopy, src->location); \
        retval->location = stringcopy; \

    /* Copy errors */
    siz = sizeof (MOJOSHADER_error) * src->error_count;
    retval->error_count = src->error_count;
    retval->errors = (MOJOSHADER_error *) m(siz, d);
    // !!! FIXME: Out of memory check!
    memset(retval->errors, '\0', siz);
    for (i = 0; i < retval->error_count; i++)
    {
        COPY_STRING(errors[i].error)
        COPY_STRING(errors[i].filename)
        retval->errors[i].error_position = src->errors[i].error_position;
    } // for

    /* Copy profile string constant */
    retval->profile = src->profile;

    /* Copy shader output */
    retval->output_len = src->output_len;
    stringcopy = (char *) m(src->output_len, d);
    memcpy(stringcopy, src->output, src->output_len);
    retval->output = stringcopy;

    /* Copy miscellaneous shader info */
    retval->instruction_count = src->instruction_count;
    retval->shader_type = src->shader_type;
    retval->major_ver = src->major_ver;
    retval->minor_ver = src->minor_ver;

    /* Copy uniforms */
    siz = sizeof (MOJOSHADER_uniform) * src->uniform_count;
    retval->uniform_count = src->uniform_count;
    retval->uniforms = (MOJOSHADER_uniform *) m(siz, d);
    // !!! FIXME: Out of memory check!
    memset(retval->uniforms, '\0', siz);
    for (i = 0; i < retval->uniform_count; i++)
    {
        retval->uniforms[i].type = src->uniforms[i].type;
        retval->uniforms[i].index = src->uniforms[i].index;
        retval->uniforms[i].array_count = src->uniforms[i].array_count;
        retval->uniforms[i].constant = src->uniforms[i].constant;
        COPY_STRING(uniforms[i].name)
    } // for

    /* Copy constants */
    siz = sizeof (MOJOSHADER_constant) * src->constant_count;
    retval->constant_count = src->constant_count;
    retval->constants = (MOJOSHADER_constant *) m(siz, d);
    // !!! FIXME: Out of memory check!
    memcpy(retval->constants, src->constants, siz);

    /* Copy samplers */
    siz = sizeof (MOJOSHADER_sampler) * src->sampler_count;
    retval->sampler_count = src->sampler_count;
    retval->samplers = (MOJOSHADER_sampler *) m(siz, d);
    // !!! FIXME: Out of memory check!
    memset(retval->samplers, '\0', siz);
    for (i = 0; i < retval->sampler_count; i++)
    {
        retval->samplers[i].type = src->samplers[i].type;
        retval->samplers[i].index = src->samplers[i].index;
        COPY_STRING(samplers[i].name)
        retval->samplers[i].texbem = src->samplers[i].texbem;
    } // for

    /* Copy attributes */
    siz = sizeof (MOJOSHADER_attribute) * src->attribute_count;
    retval->attribute_count = src->attribute_count;
    retval->attributes = (MOJOSHADER_attribute *) m(siz, d);
    // !!! FIXME: Out of memory check!
    memset(retval->attributes, '\0', siz);
    for (i = 0; i < retval->attribute_count; i++)
    {
        retval->attributes[i].usage = src->attributes[i].usage;
        retval->attributes[i].index = src->attributes[i].index;
        COPY_STRING(attributes[i].name)
    } // for

    /* Copy outputs */
    siz = sizeof (MOJOSHADER_attribute) * src->output_count;
    retval->output_count = src->output_count;
    retval->outputs = (MOJOSHADER_attribute *) m(siz, d);
    // !!! FIXME: Out of memory check!
    memset(retval->outputs, '\0', siz);
    for (i = 0; i < retval->output_count; i++)
    {
        retval->outputs[i].usage = src->outputs[i].usage;
        retval->outputs[i].index = src->outputs[i].index;
        COPY_STRING(outputs[i].name)
    } // for

    #undef COPY_STRING

    /* Copy swizzles */
    siz = sizeof (MOJOSHADER_swizzle) * src->swizzle_count;
    retval->swizzle_count = src->swizzle_count;
    retval->swizzles = (MOJOSHADER_swizzle *) m(siz, d);
    // !!! FIXME: Out of memory check!
    memcpy(retval->swizzles, src->swizzles, siz);

    /* Copy symbols */
    siz = sizeof (MOJOSHADER_symbol) * src->symbol_count;
    retval->symbol_count = src->symbol_count;
    retval->symbols = (MOJOSHADER_symbol *) m(siz, d);
    // !!! FIXME: Out of memory check!
    memset(retval->symbols, '\0', siz);
    for (i = 0; i < retval->symbol_count; i++)
        copysymbol(&retval->symbols[i], &src->symbols[i], m, d);

    /* Copy preshader */
    if (src->preshader != NULL)
        retval->preshader = copypreshader(src->preshader, m, d);

    return retval;
}